

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

Var __thiscall
Js::CustomExternalWrapperObject::GetValueFromDescriptor
          (CustomExternalWrapperObject *this,Var instance,PropertyDescriptor *propertyDescriptor,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  RecyclableObject *pRVar4;
  undefined4 *puVar5;
  
  if (propertyDescriptor->valueSpecified == true) {
    pRVar4 = (RecyclableObject *)(propertyDescriptor->Value).ptr;
  }
  else {
    if (propertyDescriptor->getterSpecified == true) {
      pvVar3 = PropertyDescriptor::GetGetter(propertyDescriptor);
      pRVar4 = VarTo<Js::RecyclableObject>(pvVar3);
      pvVar3 = JavascriptOperators::CallGetter(pRVar4,instance,requestContext);
      return pvVar3;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x11b,"(0)","FALSE");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    pRVar4 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  return pRVar4;
}

Assistant:

Js::Var CustomExternalWrapperObject::GetValueFromDescriptor(Js::Var instance, Js::PropertyDescriptor propertyDescriptor, Js::ScriptContext * requestContext)
{
    if (propertyDescriptor.ValueSpecified())
    {
        return propertyDescriptor.GetValue();
    }
    if (propertyDescriptor.GetterSpecified())
    {
        return Js::JavascriptOperators::CallGetter(VarTo<RecyclableObject>(propertyDescriptor.GetGetter()), instance, requestContext);
    }
    Assert(FALSE);
    return requestContext->GetLibrary()->GetUndefined();
}